

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O3

void Maj_ManPrintSolution(Maj_Man_t *p)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char *__format;
  ulong uVar4;
  int (*paiVar5) [32];
  int (*paiVar6) [32];
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  printf("Realization of %d-input majority using %d MAJ3 gates:\n",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nNodes);
  iVar2 = p->nObjs;
  if (p->nVars + 2 < iVar2) {
    paiVar5 = p->VarMarks[(long)iVar2 + -1] + 2;
    lVar8 = (long)iVar2;
    do {
      lVar1 = lVar8 + -1;
      printf("%02d = MAJ(",(ulong)((int)lVar8 - 3));
      lVar8 = 2;
      paiVar6 = paiVar5;
      do {
        iVar2 = p->nObjs;
        if (iVar2 < 1) {
LAB_005a8ba2:
          __assert_fail("Count == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                        ,0xb6,"int Maj_ManFindFanin(Maj_Man_t *, int, int)");
        }
        uVar4 = 0;
        uVar7 = 0xffffffff;
        iVar3 = 0;
        do {
          if ((*paiVar6)[uVar4] != 0) {
            iVar2 = bmcg_sat_solver_read_cex_varvalue(p->pSat,(*paiVar6)[uVar4]);
            if (iVar2 != 0) {
              uVar7 = uVar4 & 0xffffffff;
            }
            iVar3 = iVar3 + (uint)(iVar2 != 0);
            iVar2 = p->nObjs;
          }
          uVar4 = uVar4 + 1;
        } while ((long)uVar4 < (long)iVar2);
        if (iVar3 != 1) goto LAB_005a8ba2;
        iVar2 = (int)uVar7;
        if (iVar2 < 2) {
          __format = " %d";
        }
        else if (iVar2 < p->nVars + 2) {
          uVar7 = (ulong)(iVar2 + 0x5f);
          __format = " %c";
        }
        else {
          uVar7 = (ulong)(iVar2 - 2);
          __format = " %02d";
        }
        printf(__format,uVar7);
        paiVar6 = paiVar6 + -1;
        bVar9 = lVar8 != 0;
        lVar8 = lVar8 + -1;
      } while (bVar9);
      puts(" )");
      paiVar5 = paiVar5 + -3;
      lVar8 = lVar1;
    } while ((long)p->nVars + 2 < lVar1);
  }
  return;
}

Assistant:

void Maj_ManPrintSolution( Maj_Man_t * p )
{
    int i, k, iVar;
    printf( "Realization of %d-input majority using %d MAJ3 gates:\n", p->nVars, p->nNodes );
//    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    for ( i = p->nObjs - 1; i >= p->nVars + 2; i-- )
    {
        printf( "%02d = MAJ(", i-2 );
        for ( k = 2; k >= 0; k-- )
        {
            iVar = Maj_ManFindFanin( p, i, k );
            if ( iVar >= 2 && iVar < p->nVars + 2 )
                printf( " %c", 'a'+iVar-2 );
            else if ( iVar < 2 )
                printf( " %d", iVar );
            else
                printf( " %02d", iVar-2 );
        }
        printf( " )\n" );
    }
}